

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O3

void ImGuiStb::stb_textedit_clamp(ImGuiInputTextState *str,STB_TexteditState *state)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = (int)str;
  iVar1 = state->select_start;
  iVar2 = state->select_end;
  if (iVar1 != iVar2) {
    if (iVar3 < iVar1) {
      state->select_start = iVar3;
      iVar1 = iVar3;
    }
    if (iVar3 < iVar2) {
      state->select_end = iVar3;
      iVar2 = iVar3;
    }
    if (iVar1 == iVar2) {
      state->cursor = iVar1;
    }
  }
  if (iVar3 < state->cursor) {
    state->cursor = iVar3;
  }
  return;
}

Assistant:

static void stb_textedit_clamp(STB_TEXTEDIT_STRING *str, STB_TexteditState *state)
{
   int n = STB_TEXTEDIT_STRINGLEN(str);
   if (STB_TEXT_HAS_SELECTION(state)) {
      if (state->select_start > n) state->select_start = n;
      if (state->select_end   > n) state->select_end = n;
      // if clamping forced them to be equal, move the cursor to match
      if (state->select_start == state->select_end)
         state->cursor = state->select_start;
   }
   if (state->cursor > n) state->cursor = n;
}